

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
AdapterImpl(AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
            *this,PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                  *fulfiller,Canceler *canceler,
           Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *inner)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation local_88 [2];
  SourceLocation local_58;
  Canceler *local_40;
  Type local_38;
  Promise<void> local_30;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *local_28;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *inner_local;
  Canceler *canceler_local;
  PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
  *fulfiller_local;
  AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this_local;
  
  local_28 = inner;
  inner_local = (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
                canceler;
  canceler_local = (Canceler *)fulfiller;
  fulfiller_local =
       (PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
       this;
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_00c0c5a0;
  this->fulfiller =
       (PromiseFulfiller<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
       canceler_local;
  local_38.fulfiller = (PromiseFulfiller<unsigned_int> *)canceler_local;
  local_40 = canceler_local;
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::
  then<kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::AdapterImpl(kj::PromiseFulfiller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>&,kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>)::_lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)_1_,kj::Canceler::AdapterImpl<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>::PromiseFulfiller(kj::PromiseFulfiller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>&,kj::Canceler&,kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>)::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>> *)
             &local_30,(Type *)inner,&local_38,location);
  SourceLocation::SourceLocation
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.h"
             ,"AdapterImpl",0x393,0x11);
  location_00.function = local_88[0].function;
  location_00.fileName = local_88[0].fileName;
  location_00.lineNumber = local_88[0].lineNumber;
  location_00.columnNumber = local_88[0].columnNumber;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_30,location_00);
  Promise<void>::~Promise(&local_30);
  return;
}

Assistant:

AdapterImpl(PromiseFulfiller<T>& fulfiller,
                Canceler& canceler, Promise<T> inner)
        : AdapterBase(canceler),
          fulfiller(fulfiller),
          inner(inner.then(
              [&fulfiller](T&& value) { fulfiller.fulfill(kj::mv(value)); },
              [&fulfiller](Exception&& e) { fulfiller.reject(kj::mv(e)); })
              .eagerlyEvaluate(nullptr)) {}